

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O3

void __thiscall sentencepiece::NBestSentencePieceText::Clear(NBestSentencePieceText *this)

{
  void **ppvVar1;
  Rep *pRVar2;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  lVar6 = (long)(this->nbests_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar6) {
    pRVar2 = (this->nbests_).super_RepeatedPtrFieldBase.rep_;
    lVar5 = 0;
    do {
      ppvVar1 = pRVar2->elements + lVar5;
      lVar5 = lVar5 + 1;
      SentencePieceText::Clear((SentencePieceText *)*ppvVar1);
    } while (lVar6 != lVar5);
    (this->nbests_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  pvVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    uVar4 = (ulong)pvVar3 & 0xfffffffffffffffe;
    *(undefined8 *)(uVar4 + 0x10) = 0;
    **(undefined1 **)(uVar4 + 8) = 0;
  }
  return;
}

Assistant:

void NBestSentencePieceText::Clear() {
// @@protoc_insertion_point(message_clear_start:sentencepiece.NBestSentencePieceText)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  nbests_.Clear();
  _internal_metadata_.Clear<std::string>();
}